

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::JsonObjectWriter::~JsonObjectWriter(JsonObjectWriter *this)

{
  uint64_t uVar1;
  ostream *poVar2;
  char local_22;
  char local_21;
  
  if (this->m_active == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,&local_22,1);
    poVar2 = this->m_os;
    uVar1 = this->m_indent_level;
    if (uVar1 != 0) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      poVar2 = this->m_os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_21,1);
  }
  return;
}

Assistant:

JsonObjectWriter::~JsonObjectWriter() {
        if ( !m_active ) { return; }

        m_os << '\n';
        JsonUtils::indent( m_os, m_indent_level );
        m_os << '}';
    }